

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall
cfd::core::Psbt::SetTxInSignature(Psbt *this,uint32_t index,KeyData *key,ByteData *signature)

{
  void *pvVar1;
  CfdException *this_00;
  undefined4 in_register_00000034;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  int local_84;
  Pubkey local_80;
  undefined1 local_68 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x953,"SetTxInSignature");
  pvVar1 = this->wally_psbt_pointer_;
  KeyData::GetPubkey(&local_80,key);
  Pubkey::GetData((ByteData *)local_68,&local_80);
  ByteData::GetBytes(&local_48,(ByteData *)local_68);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,signature);
  local_84 = wally_psbt_input_add_signature
                       ((ulong)index * 0x110 + *(long *)((long)pvVar1 + 0x10),
                        local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        local_80.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_80.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  if (local_84 == 0) {
    if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_68._0_8_ = "cfdcore_psbt.cpp";
  local_68._8_4_ = 0x95d;
  local_68._16_8_ = "SetTxInSignature";
  logger::log<int&>((CfdSourceLocation *)local_68,kCfdLogLevelWarning,
                    "wally_psbt_input_add_signature NG[{}]",&local_84);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._0_8_ = local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"psbt add input sig error.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInSignature(
    uint32_t index, const KeyData &key, const ByteData &signature) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  auto pubkey = key.GetPubkey().GetData().GetBytes();
  auto sig = signature.GetBytes();

  int ret = wally_psbt_input_add_signature(
      &psbt_pointer->inputs[index], pubkey.data(), pubkey.size(), sig.data(),
      sig.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_add_signature NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add input sig error.");
  }
}